

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.h
# Opt level: O3

void __thiscall Histogram::Histogram(Histogram *this,Histogram *src)

{
  double dVar1;
  size_t i;
  HistBin *pHVar2;
  long lVar3;
  
  pHVar2 = (HistBin *)operator_new__(0x208);
  this->bins = pHVar2;
  dVar1 = src->EXP_BASE_LOG;
  this->EXP_BASE = src->EXP_BASE;
  this->EXP_BASE_LOG = dVar1;
  LOCK();
  (this->count).super___atomic_base<unsigned_long>._M_i =
       (src->count).super___atomic_base<unsigned_long>._M_i;
  UNLOCK();
  LOCK();
  (this->sum).super___atomic_base<unsigned_long>._M_i =
       (src->sum).super___atomic_base<unsigned_long>._M_i;
  UNLOCK();
  LOCK();
  (this->max).super___atomic_base<unsigned_long>._M_i =
       (src->max).super___atomic_base<unsigned_long>._M_i;
  UNLOCK();
  lVar3 = 0;
  do {
    LOCK();
    this->bins[lVar3].super___atomic_base<unsigned_long>._M_i =
         src->bins[lVar3].super___atomic_base<unsigned_long>._M_i;
    UNLOCK();
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x41);
  return;
}

Assistant:

Histogram(const Histogram& src) {
        bins = new HistBin[MAX_BINS];
        // It will invoke `operator=()` below.
        *this = src;
    }